

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::findStructConstant
          (Builder *this,Id typeId,vector<unsigned_int,_std::allocator<unsigned_int>_> *comps)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Id IVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference ppIVar7;
  const_reference pvVar8;
  Id local_50;
  int local_38;
  int op;
  bool mismatch;
  int i;
  bool found;
  Instruction *constant;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *comps_local;
  Builder *pBStack_10;
  Id typeId_local;
  Builder *this_local;
  
  _i = (Instruction *)0x0;
  bVar2 = false;
  op = 0;
  comps_local._4_4_ = typeId;
  pBStack_10 = this;
  do {
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedStructConstants,(key_type *)((long)&comps_local + 4));
    sVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar5);
    if ((int)sVar6 <= op) {
LAB_006d7fbd:
      if (bVar2) {
        local_50 = spv::Instruction::getResultId(_i);
      }
      else {
        local_50 = 0;
      }
      return local_50;
    }
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedStructConstants,(key_type *)((long)&comps_local + 4));
    ppIVar7 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar5,(long)op);
    _i = *ppIVar7;
    bVar1 = false;
    local_38 = 0;
    while( true ) {
      iVar3 = spv::Instruction::getNumOperands(_i);
      if (iVar3 <= local_38) break;
      IVar4 = spv::Instruction::getIdOperand(_i,local_38);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (comps,(long)local_38);
      if (IVar4 != *pvVar8) {
        bVar1 = true;
        break;
      }
      local_38 = local_38 + 1;
    }
    if (!bVar1) {
      bVar2 = true;
      goto LAB_006d7fbd;
    }
    op = op + 1;
  } while( true );
}

Assistant:

Id Builder::findStructConstant(Id typeId, const std::vector<Id>& comps)
{
    Instruction* constant = nullptr;
    bool found = false;
    for (int i = 0; i < (int)groupedStructConstants[typeId].size(); ++i) {
        constant = groupedStructConstants[typeId][i];

        // same contents?
        bool mismatch = false;
        for (int op = 0; op < constant->getNumOperands(); ++op) {
            if (constant->getIdOperand(op) != comps[op]) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch) {
            found = true;
            break;
        }
    }

    return found ? constant->getResultId() : NoResult;
}